

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Vec3_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  byte bVar1;
  ulong uVar2;
  ulong *buf_00;
  double dVar3;
  char *pcVar4;
  int err;
  ulong uVar5;
  ulong *puVar6;
  byte *pbVar7;
  ulong *puVar8;
  bool bVar9;
  int more;
  int8_t val;
  uint64_t value;
  int local_58;
  int8_t local_51;
  double local_50;
  undefined4 *local_48;
  int local_3c;
  void *local_38;
  
  local_48 = (undefined4 *)struct_base;
  if ((buf == end) || (*buf != '{')) {
    local_58 = 0;
    puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,buf,end,0x15);
    goto LAB_0010fb11;
  }
  puVar6 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar6 < 2) {
LAB_0010fac3:
    puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
  }
  else if ((char)(byte)*puVar6 < '!') {
    if (((byte)*puVar6 != 0x20) || (buf[2] < '!')) goto LAB_0010fac3;
    puVar6 = (ulong *)(buf + 2);
  }
  if ((puVar6 == (ulong *)end) || ((byte)*puVar6 != 0x7d)) {
    local_58 = 1;
    puVar8 = puVar6;
    goto LAB_0010fb11;
  }
  local_58 = 0;
  puVar8 = (ulong *)((long)puVar6 + 1);
  if (1 < (long)end - (long)puVar8) {
    if (' ' < (char)*(byte *)puVar8) goto LAB_0010fb11;
    if ((*(byte *)puVar8 == 0x20) && (' ' < (char)*(byte *)((long)puVar6 + 2))) {
      puVar8 = (ulong *)((long)puVar6 + 2);
      goto LAB_0010fb11;
    }
  }
  puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
LAB_0010fb11:
  if (local_58 != 0) {
    local_38 = (void *)((long)local_48 + 0x1a);
    do {
      if (puVar8 != (ulong *)end) {
        if ((byte)*puVar8 == 0x2e) {
          puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar8,end,5);
        }
        else if ((byte)*puVar8 == 0x22) {
          puVar8 = (ulong *)((long)puVar8 + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar5 = (long)end - (long)puVar8;
      if (uVar5 < 8) {
        uVar2 = 0;
        switch(uVar5) {
        case 7:
          uVar2 = (long)(char)*(byte *)((long)puVar8 + 6) << 8;
        case 6:
          uVar2 = uVar2 | (long)(char)*(byte *)((long)puVar8 + 5) << 0x10;
        case 5:
          uVar2 = uVar2 | (long)(char)*(byte *)((long)puVar8 + 4) << 0x18;
        case 4:
          uVar2 = uVar2 | (long)(char)*(byte *)((long)puVar8 + 3) << 0x20;
        case 3:
          uVar2 = uVar2 | (long)(char)*(byte *)((long)puVar8 + 2) << 0x28;
        case 2:
          uVar2 = uVar2 | (long)(char)*(byte *)((long)puVar8 + 1) << 0x30;
        case 1:
          uVar2 = uVar2 | (ulong)(byte)*puVar8 << 0x38;
        }
      }
      else {
        uVar2 = *puVar8;
        uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
      }
      puVar6 = puVar8;
      if (uVar2 < 0x7465737433000000) {
        if ((uVar2 & 0x7fffffffff000000) == 0x7465737431000000) {
          if (5 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar8 + 5);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar7 = (byte *)((long)puVar8 + 6);
                goto LAB_0010fe8b;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar7 = (byte *)((long)puVar8 + 5);
              ctx->unquoted = 0;
LAB_0010fe8b:
              if ((long)end - (long)pbVar7 < 2) {
LAB_0010ff15:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_0010ff15;
                pbVar7 = pbVar7 + 1;
              }
              if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
                puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
              }
              else {
                puVar6 = (ulong *)(pbVar7 + 1);
                if ((long)end - (long)puVar6 < 2) {
LAB_001101a9:
                  puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
                }
                else if ((char)(byte)*puVar6 < '!') {
                  if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_001101a9;
                  puVar6 = (ulong *)(pbVar7 + 2);
                }
              }
            }
          }
          if (puVar8 == puVar6) goto LAB_001104ed;
          local_50 = 0.0;
          buf_00 = (ulong *)flatcc_json_parser_double(ctx,(char *)puVar6,end,&local_50);
          if ((puVar6 == buf_00) &&
             (puVar8 = (ulong *)flatcc_json_parser_symbolic_double
                                          (ctx,(char *)buf_00,end,
                                           MyGame_Example_Vec3_parse_json_struct_inline::
                                           symbolic_parsers_1,&local_50), bVar9 = puVar8 == buf_00,
             buf_00 = puVar8, puVar8 == (ulong *)end || bVar9)) {
LAB_0011052e:
            bVar9 = false;
          }
          else {
            *(double *)(local_48 + 4) = local_50;
LAB_00110548:
            bVar9 = true;
            puVar8 = buf_00;
          }
LAB_0011054a:
          if (!bVar9) {
            pcVar4 = flatcc_json_parser_set_error(ctx,(char *)puVar8,end,0x23);
            return pcVar4;
          }
        }
        else {
          if ((uVar2 & 0x7fffffffff000000) == 0x7465737432000000) {
            if (5 < (long)uVar5) {
              bVar1 = *(byte *)((long)puVar8 + 5);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar7 = (byte *)((long)puVar8 + 6);
                  goto LAB_0010fe5d;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar7 = (byte *)((long)puVar8 + 5);
                ctx->unquoted = 0;
LAB_0010fe5d:
                if ((long)end - (long)pbVar7 < 2) {
LAB_0010fead:
                  pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
                }
                else if ((char)*pbVar7 < '!') {
                  if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_0010fead;
                  pbVar7 = pbVar7 + 1;
                }
                if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
                  puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
                }
                else {
                  puVar6 = (ulong *)(pbVar7 + 1);
                  if ((long)end - (long)puVar6 < 2) {
LAB_001100b0:
                    puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
                  }
                  else if ((char)(byte)*puVar6 < '!') {
                    if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_001100b0;
                    puVar6 = (ulong *)(pbVar7 + 2);
                  }
                }
              }
            }
            if (puVar8 != puVar6) {
              local_51 = '\0';
              local_50 = 0.0;
              local_3c = 0;
              buf_00 = puVar6;
              if ((puVar6 != (ulong *)end) &&
                 (buf_00 = (ulong *)flatcc_json_parser_integer
                                              (ctx,(char *)puVar6,end,&local_3c,
                                               (uint64_t *)&local_50), buf_00 != puVar6)) {
                if (local_3c == 0) {
                  dVar3 = local_50;
                  if ((ulong)local_50 < 0x80) goto LAB_00110156;
                  err = 7;
                }
                else {
                  if ((ulong)local_50 < 0x81) {
                    dVar3 = (double)-(long)local_50;
LAB_00110156:
                    local_51 = SUB81(dVar3,0);
                    goto LAB_0011015a;
                  }
                  err = 8;
                }
                buf_00 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,err);
              }
LAB_0011015a:
              if ((puVar6 != buf_00) ||
                 (puVar8 = (ulong *)flatcc_json_parser_symbolic_int8
                                              (ctx,(char *)buf_00,end,
                                               MyGame_Example_Vec3_parse_json_struct_inline::
                                               symbolic_parsers,&local_51), bVar9 = puVar8 != buf_00
                 , buf_00 = puVar8, puVar8 != (ulong *)end && bVar9)) {
                *(int8_t *)(local_48 + 6) = local_51;
                goto LAB_00110548;
              }
              bVar9 = false;
              goto LAB_0011054a;
            }
          }
LAB_0010fdf9:
          puVar8 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar6,end);
        }
      }
      else if ((uint)(uVar2 >> 0x3b) < 0xf) {
        if ((uVar2 & 0x7fffffffff000000) != 0x7465737433000000) goto LAB_0010fdf9;
        if (5 < (long)uVar5) {
          bVar1 = *(byte *)((long)puVar8 + 5);
          if (ctx->unquoted == 0) {
            if (bVar1 == 0x22) {
              pbVar7 = (byte *)((long)puVar8 + 6);
              goto LAB_0010ff8e;
            }
          }
          else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
            pbVar7 = (byte *)((long)puVar8 + 5);
            ctx->unquoted = 0;
LAB_0010ff8e:
            if ((long)end - (long)pbVar7 < 2) {
LAB_0010ffda:
              pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
            }
            else if ((char)*pbVar7 < '!') {
              if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_0010ffda;
              pbVar7 = pbVar7 + 1;
            }
            if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
              puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
            }
            else {
              puVar6 = (ulong *)(pbVar7 + 1);
              if ((long)end - (long)puVar6 < 2) {
LAB_00110366:
                puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
              }
              else if ((char)(byte)*puVar6 < '!') {
                if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_00110366;
                puVar6 = (ulong *)(pbVar7 + 2);
              }
            }
          }
        }
        if (puVar8 == puVar6) goto LAB_0010fdf9;
        puVar8 = (ulong *)MyGame_Example_Test_parse_json_struct_inline
                                    (ctx,(char *)puVar6,end,local_38);
      }
      else {
        if ((byte)(uVar2 >> 0x38) < 0x79) {
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar8 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar7 = (byte *)((long)puVar8 + 2);
                goto LAB_0010ffbc;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar7 = (byte *)((long)puVar8 + 1);
              ctx->unquoted = 0;
LAB_0010ffbc:
              if ((long)end - (long)pbVar7 < 2) {
LAB_00110033:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_00110033;
                pbVar7 = pbVar7 + 1;
              }
              if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
                puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
              }
              else {
                puVar6 = (ulong *)(pbVar7 + 1);
                if ((long)end - (long)puVar6 < 2) {
LAB_00110395:
                  puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
                }
                else if ((char)(byte)*puVar6 < '!') {
                  if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_00110395;
                  puVar6 = (ulong *)(pbVar7 + 2);
                }
              }
            }
          }
          if (puVar8 != puVar6) {
            local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
            buf_00 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar6,end,(float *)&local_50);
            if ((puVar6 != buf_00) ||
               (puVar8 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)buf_00,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_2,(float *)&local_50),
               bVar9 = puVar8 != buf_00, buf_00 = puVar8, puVar8 != (ulong *)end && bVar9)) {
              *local_48 = local_50._0_4_;
              goto LAB_00110548;
            }
            goto LAB_0011052e;
          }
        }
        else if ((uVar2 & 0xff00000000000000) == 0x7900000000000000) {
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar8 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar7 = (byte *)((long)puVar8 + 2);
                goto LAB_00110274;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar7 = (byte *)((long)puVar8 + 1);
              ctx->unquoted = 0;
LAB_00110274:
              if ((long)end - (long)pbVar7 < 2) {
LAB_001102fe:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_001102fe;
                pbVar7 = pbVar7 + 1;
              }
              if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
                puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
              }
              else {
                puVar6 = (ulong *)(pbVar7 + 1);
                if ((long)end - (long)puVar6 < 2) {
LAB_001104ac:
                  puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
                }
                else if ((char)(byte)*puVar6 < '!') {
                  if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_001104ac;
                  puVar6 = (ulong *)(pbVar7 + 2);
                }
              }
            }
          }
          if (puVar8 != puVar6) {
            local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
            buf_00 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar6,end,(float *)&local_50);
            if ((puVar6 == buf_00) &&
               (puVar8 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)buf_00,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_4,(float *)&local_50),
               bVar9 = puVar8 == buf_00, buf_00 = puVar8, puVar8 == (ulong *)end || bVar9))
            goto LAB_0011052e;
            local_48[1] = local_50._0_4_;
            goto LAB_00110548;
          }
        }
        else {
          if ((uVar2 & 0xff00000000000000) != 0x7a00000000000000) goto LAB_0010fdf9;
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar8 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar7 = (byte *)((long)puVar8 + 2);
                goto LAB_00110246;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar7 = (byte *)((long)puVar8 + 1);
              ctx->unquoted = 0;
LAB_00110246:
              if ((long)end - (long)pbVar7 < 2) {
LAB_00110296:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar7[1] < '!')) goto LAB_00110296;
                pbVar7 = pbVar7 + 1;
              }
              if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x3a)) {
                puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,4);
              }
              else {
                puVar6 = (ulong *)(pbVar7 + 1);
                if ((long)end - (long)puVar6 < 2) {
LAB_00110420:
                  puVar6 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar6,end);
                }
                else if ((char)(byte)*puVar6 < '!') {
                  if (((byte)*puVar6 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_00110420;
                  puVar6 = (ulong *)(pbVar7 + 2);
                }
              }
            }
          }
          if (puVar8 != puVar6) {
            local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
            buf_00 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar6,end,(float *)&local_50);
            if ((puVar6 != buf_00) ||
               (puVar8 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)buf_00,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_3,(float *)&local_50),
               bVar9 = puVar8 != buf_00, buf_00 = puVar8, puVar8 != (ulong *)end && bVar9)) {
              local_48[2] = local_50._0_4_;
              goto LAB_00110548;
            }
            goto LAB_0011052e;
          }
        }
LAB_001104ed:
        puVar8 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar6,end);
      }
      puVar8 = (ulong *)flatcc_json_parser_object_end(ctx,(char *)puVar8,end,&local_58);
    } while (local_58 != 0);
  }
  return (char *)puVar8;
}

Assistant:

static const char *MyGame_Example_Vec3_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x7465737433000000) { /* branch "test3" */
            if ((w & 0xffffffffff000000) == 0x7465737432000000) { /* "test2" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    int8_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            MyGame_Example_Color_parse_json_enum,
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 24);
                    buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int8_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "test2" */
                if ((w & 0xffffffffff000000) == 0x7465737431000000) { /* "test1" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        double val = 0;
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                monster_test_local_MyGame_Example_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        pval = (void *)((size_t)struct_base + 16);
                        buf = flatcc_json_parser_double(ctx, (mark = buf), end, &val);
                        if (mark == buf) {
                            buf = flatcc_json_parser_symbolic_double(ctx, (mark = buf), end, symbolic_parsers, &val);
                            if (buf == mark || buf == end) goto failed;
                        }
                        flatbuffers_double_write_to_pe(pval, val);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test1" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test1" */
            } /* "test2" */
        } else { /* branch "test3" */
            if (w < 0x7800000000000000) { /* branch "x" */
                if ((w & 0xffffffffff000000) == 0x7465737433000000) { /* "test3" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        pval = (void *)((size_t)struct_base + 26);
                        buf = MyGame_Example_Test_parse_json_struct_inline(ctx, buf, end, pval);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test3" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test3" */
            } else { /* branch "x" */
                if (w < 0x7900000000000000) { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 0);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "x" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "x" */
                } else { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7a00000000000000) { /* "z" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 8);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "z" */
                        if ((w & 0xff00000000000000) == 0x7900000000000000) { /* "y" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                float val = 0;
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        monster_test_local_MyGame_Example_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                pval = (void *)((size_t)struct_base + 4);
                                buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                if (mark == buf) {
                                    buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                    if (buf == mark || buf == end) goto failed;
                                }
                                flatbuffers_float_write_to_pe(pval, val);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "y" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "y" */
                    } /* "z" */
                } /* branch "y" */
            } /* branch "x" */
        } /* branch "test3" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}